

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O1

void wirehair::AddInvertibleGF2Matrix(uint64_t *matrix,uint offset,uint pitchWords,uint n)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  uint uVar16;
  uint uVar17;
  uint64_t oldstate;
  uint uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong *local_58;
  
  if (n < 0x200) {
    if (n != 0) {
      lVar1 = (ulong)(byte)kInvertibleMatrixSeeds[n] * 2 + 1;
      uVar13 = offset & 0x3f;
      puVar19 = matrix + (offset >> 6);
      uVar12 = lVar1 * 0x5851f42d4c957f2e;
      uVar17 = 0x40 - uVar13;
      uVar18 = n;
      if (uVar17 < n) {
        uVar18 = uVar17;
      }
      uVar7 = ~(-1L << ((ulong)n & 0x3f));
      if (0x3f < n) {
        uVar7 = 0xffffffffffffffff;
        uVar18 = uVar17;
      }
      local_58 = matrix + (ulong)(offset >> 6) + 1;
      uVar10 = 0;
      do {
        uVar11 = uVar12 * 0x5851f42d4c957f2d + lVar1;
        uVar16 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
        bVar4 = (byte)(uVar12 >> 0x3b);
        uVar12 = uVar11 * 0x5851f42d4c957f2d + lVar1;
        uVar6 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
        bVar5 = (byte)(uVar11 >> 0x3b);
        uVar11 = CONCAT44(uVar6 >> bVar5 | uVar6 << 0x20 - bVar5,
                          uVar16 >> bVar4 | uVar16 << 0x20 - bVar4);
        *puVar19 = *puVar19 ^ (uVar11 & uVar7) << uVar13;
        puVar15 = local_58;
        uVar6 = n - uVar18;
        if (n - uVar18 != 0) {
          do {
            uVar8 = uVar11 >> ((ulong)uVar17 & 0x3f);
            if (uVar13 == 0) {
              uVar8 = 0;
            }
            if (uVar13 < uVar6) {
              uVar20 = uVar12 * 0x5851f42d4c957f2d + lVar1;
              uVar14 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
              bVar4 = (byte)(uVar12 >> 0x3b);
              uVar12 = uVar20 * 0x5851f42d4c957f2d + lVar1;
              uVar16 = (uint)(uVar20 >> 0x2d) ^ (uint)(uVar20 >> 0x1b);
              bVar5 = (byte)(uVar20 >> 0x3b);
              uVar20 = CONCAT44(uVar16 >> bVar5 | uVar16 << 0x20 - bVar5,
                                uVar14 >> bVar4 | uVar14 << 0x20 - bVar4);
              uVar8 = uVar8 | uVar20 << uVar13;
            }
            else {
              uVar20 = 0;
            }
            uVar9 = ~(-1L << ((ulong)uVar6 & 0x3f));
            if (0x3f < uVar6) {
              uVar9 = 0xffffffffffffffff;
            }
            *puVar15 = *puVar15 ^ uVar9 & uVar8;
            uVar16 = uVar6;
            if (0x40 < uVar6) {
              uVar11 = uVar20;
              uVar16 = uVar6 - 0x40;
            }
            bVar3 = 0x40 < uVar6;
            puVar15 = puVar15 + 1;
            uVar6 = uVar16;
          } while (bVar3);
        }
        uVar10 = uVar10 + 1;
        puVar19 = puVar19 + pitchWords;
        local_58 = local_58 + pitchWords;
      } while (uVar10 != n);
    }
  }
  else {
    uVar13 = offset + 1;
    uVar17 = 1;
    uVar18 = offset;
    do {
      matrix[uVar18 >> 6] = matrix[uVar18 >> 6] ^ 1L << ((ulong)((offset + uVar17) - 1) & 0x3f);
      if (uVar17 < n) {
        matrix[uVar13 >> 6] = matrix[uVar13 >> 6] ^ 1L << ((ulong)(offset + uVar17) & 0x3f);
      }
      matrix = matrix + pitchWords;
      uVar18 = uVar18 + 1;
      uVar13 = uVar13 + 1;
      iVar2 = (1 - n) + uVar17;
      uVar17 = uVar17 + 1;
    } while (iVar2 != 1);
  }
  return;
}

Assistant:

void AddInvertibleGF2Matrix(
    uint64_t * GF256_RESTRICT matrix, ///< Address of upper left word
    const unsigned offset, ///< Offset in bits to the first sum column
    const unsigned pitchWords, ///< Pitch of the matrix in words
    const unsigned n ///< Number of bits in the matrix to generate
)
{
    // If we do not have this value of n in the table:
    if (n >= kMatrixSeedCount)
    {
        uint64_t * row = matrix;

        // For each row:
        for (unsigned ii = 0; ii < n; ++ii, row += pitchWords)
        {
            // Flip diagonal bit
            const unsigned column_i = offset + ii;
            row[column_i >> 6] ^= (uint64_t)1 << (column_i & 63);

            // Flip an off-diagonal bit also
            if (ii + 1 < n) {
                const unsigned column_j = column_i + 1;
                row[column_j >> 6] ^= (uint64_t)1 << (column_j & 63);
            }
        }

        return;
    }

    // Pull a random matrix out of the lookup table
    const uint8_t seed = kInvertibleMatrixSeeds[n];

    PCGRandom prng;
    prng.Seed(seed);

    const unsigned shift = offset & 63;
    uint64_t * row = matrix + (offset >> 6);

    // For each row to generate:
    for (unsigned row_i = 0; row_i < n; ++row_i, row += pitchWords)
    {
        uint64_t * dest = row;
        unsigned target = n;

        // Unroll the first word
        uint64_t prev = 0;

        // Generate first word
        const uint64_t word0 = Random64(prng);

        uint64_t temp0 = word0;

        unsigned written0 = 64 - shift;

        // Handle short writes
        if (target < 64) {
            temp0 &= ((uint64_t)1 << target) - 1;
            if (written0 > target) {
                written0 = target;
            }
        }

        // Add partial word into front
        *dest++ ^= temp0 << shift;

        target -= written0;
        prev = word0;

        if (target <= 0) {
            continue;
        }

        // For each remaining word:
        for (;;)
        {
            uint64_t temp = 0;
            if (shift != 0) {
                temp = prev >> (64 - shift);
            }
            uint64_t word = 0;

            // If it needs another word:
            if (target > shift) {
                // Generate next word
                word = Random64(prng);
                temp |= (word << shift);
            }

            if (target < 64) {
                temp &= ((uint64_t)1 << target) - 1;
            }

            // Add partial word
            *dest ^= temp;

            if (target <= 64) {
                break;
            }

            target -= 64;
            ++dest;
            prev = word;
        }
    }
}